

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O2

int ptls_base64_decode(char *text,ptls_base64_decode_state_t *state,ptls_buffer_t *buf)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  sbyte sVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  bool bVar13;
  uint8_t decoded [3];
  
  lVar7 = 0;
  while ((uVar4 = (ulong)(byte)text[lVar7], uVar4 < 0x21 &&
         ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0))) {
    lVar7 = lVar7 + 1;
  }
  iVar3 = 0;
  do {
    if (iVar3 != 0) {
      return iVar3;
    }
    bVar5 = (byte)uVar4;
    if (bVar5 == 0) {
      return 0;
    }
    if (state->status != 1) {
      return 0;
    }
    lVar8 = lVar7 + 1;
    if (bVar5 < 0x7f) {
      cVar1 = ptls_base64_values[(char)bVar5];
      iVar10 = state->nbc;
      if ((int)cVar1 == 0xffffffff) {
        bVar13 = bVar5 == 0x3d;
        if (!bVar13 || iVar10 != 2) goto LAB_0011ed21;
        if (text[lVar8] != '=') goto LAB_0011ede0;
        state->nbc = 4;
        lVar8 = lVar7 + 2;
        iVar3 = 1;
        sVar6 = 0xc;
        goto LAB_0011ed3f;
      }
      state->nbc = iVar10 + 1;
      uVar9 = state->v << 6 | (int)cVar1;
      state->v = uVar9;
      iVar3 = 0;
      lVar7 = lVar8;
      if (iVar10 + 1 != 4) goto LAB_0011ee14;
LAB_0011ed4a:
      uVar2 = state->nbo;
      uVar4 = 0;
      if (0 < (int)uVar2) {
        uVar4 = (ulong)uVar2;
      }
      bVar5 = 0x10;
      for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
        decoded[uVar11] = (uint8_t)(uVar9 >> (bVar5 & 0x1f));
        bVar5 = bVar5 - 8;
      }
      iVar3 = ptls_buffer__do_pushv(buf,decoded,(long)(int)uVar2);
      lVar7 = lVar8;
      if (iVar3 == 0) {
        if (state->nbo < 3) {
          pcVar12 = text + lVar8;
          do {
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar1 != '\0');
          state->status = 0;
          return 0;
        }
        state->v = 0;
        state->nbc = 0;
        state->nbo = 3;
        iVar3 = 0;
      }
    }
    else {
      iVar10 = state->nbc;
      bVar13 = false;
LAB_0011ed21:
      if ((bVar13) && (iVar10 == 3)) {
        state->nbc = 4;
        iVar3 = 2;
        sVar6 = 6;
LAB_0011ed3f:
        state->nbo = iVar3;
        uVar9 = state->v << sVar6;
        state->v = uVar9;
        goto LAB_0011ed4a;
      }
LAB_0011ede0:
      while ((iVar3 = (int)uVar4, iVar3 - 9U < 5 || (iVar3 == 0x20))) {
        lVar8 = lVar7 + 1;
        lVar7 = lVar7 + 1;
        uVar4 = (ulong)(byte)text[lVar8];
      }
      if (iVar3 == 0) {
        return 0;
      }
      state->nbo = 0;
      state->status = -1;
      iVar3 = 0x232;
    }
LAB_0011ee14:
    uVar4 = (ulong)(byte)text[lVar7];
  } while( true );
}

Assistant:

int ptls_base64_decode(const char *text, ptls_base64_decode_state_t *state, ptls_buffer_t *buf)
{
    int ret = 0;
    uint8_t decoded[3];
    size_t text_index = 0;
    int c;
    signed char vc;

    /* skip initial blanks */
    while (text[text_index] != 0) {
        c = text[text_index];

        if (c == ' ' || c == '\t' || c == '\r' || c == '\n') {
            text_index++;
        } else {
            break;
        }
    }

    while (text[text_index] != 0 && ret == 0 && state->status == PTLS_BASE64_DECODE_IN_PROGRESS) {
        c = text[text_index++];

        vc = 0 < c && c < 0x7f ? ptls_base64_values[c] : -1;
        if (vc == -1) {
            if (state->nbc == 2 && c == '=' && text[text_index] == '=') {
                state->nbc = 4;
                text_index++;
                state->nbo = 1;
                state->v <<= 12;
            } else if (state->nbc == 3 && c == '=') {
                state->nbc = 4;
                state->nbo = 2;
                state->v <<= 6;
            } else {
                /* Skip final blanks */
                for (--text_index; text[text_index] != 0; ++text_index) {
                    c = text[text_index];
                    if (!(c == ' ' || c == '\t' || c == '\r' || c == '\n' || c == 0x0B || c == 0x0C))
                        break;
                }

                /* Should now be at end of buffer */
                if (text[text_index] == 0) {
                    break;
                } else {
                    /* Not at end of buffer, signal a decoding error */
                    state->nbo = 0;
                    state->status = PTLS_BASE64_DECODE_FAILED;
                    ret = PTLS_ERROR_INCORRECT_BASE64;
                }
            }
        } else {
            state->nbc++;
            state->v <<= 6;
            state->v |= vc;
        }

        if (ret == 0 && state->nbc == 4) {
            /* Convert to up to 3 octets */
            for (int j = 0; j < state->nbo; j++) {
                decoded[j] = (uint8_t)(state->v >> (8 * (2 - j)));
            }

            ret = ptls_buffer__do_pushv(buf, decoded, state->nbo);

            if (ret == 0) {
                /* test for fin or continuation */
                if (state->nbo < 3) {
                    /* Check that there are only trainling blanks on this line */
                    while (text[text_index] != 0) {
                        c = text[text_index++];

                        if (c == ' ' || c == '\t' || c == '\r' || c == '\n' || c == 0x0B || c == 0x0C) {
                            continue;
                        }
                    }
                    if (text[text_index] == 0) {
                        state->status = PTLS_BASE64_DECODE_DONE;
                    } else {
                        state->status = PTLS_BASE64_DECODE_FAILED;
                        ret = PTLS_ERROR_INCORRECT_BASE64;
                    }
                    break;
                } else {
                    state->v = 0;
                    state->nbo = 3;
                    state->nbc = 0;
                }
            }
        }
    }
    return ret;
}